

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxEpsRefine.h
# Opt level: O0

dfa_t * __thiscall
covenant::MaxEpsRefine<covenant::Sym>::refine(MaxEpsRefine<covenant::Sym> *this,cond_eps_gen_t *gen)

{
  State s;
  size_type sVar1;
  socklen_t *in_RCX;
  long in_RDX;
  sockaddr *__addr;
  DFA<covenant::Sym> *in_RDI;
  int unaff_retaddr;
  DFA<covenant::Sym> *in_stack_00000008;
  State q0;
  dfa_t *dfa;
  int in_stack_00000288;
  int in_stack_0000028c;
  cond_eps_gen_t *in_stack_00000290;
  MaxEpsRefine<covenant::Sym> *in_stack_00000298;
  CondEpsGen<covenant::Sym> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDX + 8));
  if (sVar1 == 0) {
    CondEpsGen<covenant::Sym>::getTermFactory(in_stack_ffffffffffffff88);
    DFA<covenant::Sym>::DFA
              ((DFA<covenant::Sym> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (TermFactory *)in_stack_ffffffffffffff88);
    boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)0x23b8f6);
    s = DFA<covenant::Sym>::state(in_stack_00000008,unaff_retaddr);
    DFA<covenant::Sym>::setStart(in_RDI,s);
    DFA<covenant::Sym>::accept(in_RDI,s.id,__addr,in_RCX);
  }
  else {
    maximum_refinement(in_stack_00000298,in_stack_00000290,in_stack_0000028c,in_stack_00000288);
  }
  return in_RDI;
}

Assistant:

dfa_t refine(cond_eps_gen_t& gen) 
    {
      if(gen.word.size() == 0)
      {
        // Just give an empty automaton.
        dfa_t dfa (gen.getTermFactory ());
        State q0 = dfa.state(0);
        dfa.setStart(q0);
        dfa.accept(q0);
        return dfa;
      }
      return maximum_refinement(gen, 0, 0);
    }